

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectAddSubqueryTypeInfo(Walker *pWalker,Select *p)

{
  Parse *pParse_00;
  SrcList *pSVar1;
  Select *local_48;
  Select *pSel;
  Table *pTab;
  SrcList_item *pFrom;
  SrcList *pTabList;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  if ((p->selFlags & 0x80) == 0) {
    p->selFlags = p->selFlags | 0x80;
    pParse_00 = pWalker->pParse;
    pSVar1 = p->pSrc;
    pTab = (Table *)pSVar1->a;
    for (pTabList._4_4_ = 0; pTabList._4_4_ < pSVar1->nSrc; pTabList._4_4_ = pTabList._4_4_ + 1) {
      if (((((Table *)pTab->pFKey)->tabFlags & 2) != 0) &&
         (local_48 = (Select *)pTab->zColAff, local_48 != (Select *)0x0)) {
        for (; local_48->pPrior != (Select *)0x0; local_48 = local_48->pPrior) {
        }
        sqlite3SelectAddColumnTypeAndCollation(pParse_00,(Table *)pTab->pFKey,local_48);
      }
      pTab = (Table *)&pTab->pSchema;
    }
  }
  return;
}

Assistant:

static void selectAddSubqueryTypeInfo(Walker *pWalker, Select *p){
  Parse *pParse;
  int i;
  SrcList *pTabList;
  struct SrcList_item *pFrom;

  assert( p->selFlags & SF_Resolved );
  if( p->selFlags & SF_HasTypeInfo ) return;
  p->selFlags |= SF_HasTypeInfo;
  pParse = pWalker->pParse;
  pTabList = p->pSrc;
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab = pFrom->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)!=0 ){
      /* A sub-query in the FROM clause of a SELECT */
      Select *pSel = pFrom->pSelect;
      if( pSel ){
        while( pSel->pPrior ) pSel = pSel->pPrior;
        sqlite3SelectAddColumnTypeAndCollation(pParse, pTab, pSel);
      }
    }
  }
}